

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_scanline_aa.h
# Opt level: O3

bool __thiscall
agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::
sweep_scanline<agg::scanline_p8>
          (rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_> *this,scanline_p8 *sl
          )

{
  sorted_y *psVar1;
  int iVar2;
  uint uVar3;
  span *psVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  span *psVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  cell_aa *pcVar12;
  cell_aa **ppcVar13;
  bool bVar14;
  
  iVar11 = this->m_scan_y;
  if ((this->m_outline).m_max_y < iVar11) {
    return false;
  }
  psVar4 = (sl->m_spans).m_array;
  do {
    sl->m_last_x = 0x7ffffff0;
    sl->m_cover_ptr = (sl->m_covers).m_array;
    sl->m_cur_span = psVar4;
    psVar4->len = 0;
    uVar5 = iVar11 - (this->m_outline).m_min_y;
    psVar1 = (this->m_outline).m_sorted_y.m_array;
    uVar10 = psVar1[uVar5].num;
    psVar8 = psVar4;
    if (uVar10 != 0) {
      ppcVar13 = (this->m_outline).m_sorted_cells.m_array + psVar1[uVar5].start;
      iVar11 = 0;
      do {
        pcVar12 = *ppcVar13;
        iVar9 = pcVar12->x;
        iVar2 = pcVar12->area;
        iVar11 = iVar11 + pcVar12->cover;
        uVar10 = uVar10 - 1;
        if (uVar10 == 0) {
          bVar14 = true;
        }
        else {
          do {
            ppcVar13 = ppcVar13 + 1;
            pcVar12 = *ppcVar13;
            bVar14 = pcVar12->x == iVar9;
            if (!bVar14) goto LAB_0011338b;
            iVar2 = iVar2 + pcVar12->area;
            iVar11 = iVar11 + pcVar12->cover;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        uVar10 = 0;
LAB_0011338b:
        if (iVar2 != 0) {
          uVar6 = iVar11 * 0x200 - iVar2 >> 9;
          uVar5 = -uVar6;
          if (0 < (int)uVar6) {
            uVar5 = uVar6;
          }
          uVar7 = uVar5 & 0x1ff;
          uVar6 = 0x200 - uVar7;
          if (uVar7 < 0x101) {
            uVar6 = uVar7;
          }
          if (this->m_filling_rule != fill_even_odd) {
            uVar6 = uVar5;
          }
          if (0xfe < uVar6) {
            uVar6 = 0xff;
          }
          if (this->m_gamma[uVar6] != 0) {
            scanline_p8::add_cell(sl,iVar9,this->m_gamma[uVar6]);
          }
          iVar9 = iVar9 + 1;
        }
        if ((!bVar14) && (uVar5 = pcVar12->x - iVar9, uVar5 != 0 && iVar9 <= pcVar12->x)) {
          uVar7 = (iVar11 << 9) >> 9;
          uVar6 = -uVar7;
          if (0 < (int)uVar7) {
            uVar6 = uVar7;
          }
          uVar3 = uVar6 & 0x1ff;
          uVar7 = 0x200 - uVar3;
          if (uVar3 < 0x101) {
            uVar7 = uVar3;
          }
          if (this->m_filling_rule != fill_even_odd) {
            uVar7 = uVar6;
          }
          if (0xfe < uVar7) {
            uVar7 = 0xff;
          }
          if (this->m_gamma[uVar7] != 0) {
            scanline_p8::add_span(sl,iVar9,uVar5,this->m_gamma[uVar7]);
          }
        }
      } while (uVar10 != 0);
      psVar4 = (sl->m_spans).m_array;
      psVar8 = sl->m_cur_span;
    }
    iVar9 = this->m_scan_y;
    if ((int)((ulong)((long)psVar8 - (long)psVar4) >> 4) != 0) {
      sl->m_y = iVar9;
      this->m_scan_y = iVar9 + 1;
      return true;
    }
    iVar11 = iVar9 + 1;
    this->m_scan_y = iVar11;
    if ((this->m_outline).m_max_y <= iVar9) {
      return false;
    }
  } while( true );
}

Assistant:

bool sweep_scanline(Scanline& sl)
        {
            for(;;)
            {
                if(m_scan_y > m_outline.max_y()) return false;
                sl.reset_spans();
                unsigned num_cells = m_outline.scanline_num_cells(m_scan_y);
                const cell_aa* const* cells = m_outline.scanline_cells(m_scan_y);
                int cover = 0;

                while(num_cells)
                {
                    const cell_aa* cur_cell = *cells;
                    int x    = cur_cell->x;
                    int area = cur_cell->area;
                    unsigned alpha;

                    cover += cur_cell->cover;

                    //accumulate all cells with the same X
                    while(--num_cells)
                    {
                        cur_cell = *++cells;
                        if(cur_cell->x != x) break;
                        area  += cur_cell->area;
                        cover += cur_cell->cover;
                    }

                    if(area)
                    {
                        alpha = calculate_alpha((cover << (poly_subpixel_shift + 1)) - area);
                        if(alpha)
                        {
                            sl.add_cell(x, alpha);
                        }
                        x++;
                    }

                    if(num_cells && cur_cell->x > x)
                    {
                        alpha = calculate_alpha(cover << (poly_subpixel_shift + 1));
                        if(alpha)
                        {
                            sl.add_span(x, cur_cell->x - x, alpha);
                        }
                    }
                }
        
                if(sl.num_spans()) break;
                ++m_scan_y;
            }

            sl.finalize(m_scan_y);
            ++m_scan_y;
            return true;
        }